

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

PrimInfoMB * __thiscall
embree::avx2::
CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx2::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
::createPrimRefMBArray
          (PrimInfoMB *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)1,_embree::avx2::HermiteCurveGeometryInterface,_embree::HermiteCurveT>
          *this,mvector<PrimRefMB> *prims,BBox1f *t0t1,range<unsigned_long> *r,size_t k,uint geomID)

{
  float fVar1;
  BBox1f BVar2;
  BufferView<embree::Vec3fx> *pBVar3;
  BufferView<embree::Vec3fx> *pBVar4;
  long lVar5;
  long lVar6;
  PrimRefMB *pPVar7;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar8;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar9;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar11;
  int iVar12;
  uint uVar13;
  int iVar15;
  int iVar16;
  int iVar17;
  size_t itime;
  ulong uVar18;
  long lVar19;
  unsigned_long uVar20;
  bool bVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  float fVar34;
  float fVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  float fVar39;
  undefined1 auVar38 [16];
  float fVar47;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  float fVar48;
  undefined1 auVar46 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  ulong local_218;
  size_t local_1f0;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  anon_class_16_2_07cfa4d6 local_140;
  ulong local_130;
  BBox<embree::Vec3fa> bupper1;
  BBox<embree::Vec3fa> blower0;
  BBox<embree::Vec3fa> bi;
  BBox<embree::Vec3fa> bupper0;
  BBox<embree::Vec3fa> blower1;
  ulong uVar14;
  
  (__return_storage_ptr__->object_range)._begin = 0;
  uVar20 = r->_begin;
  local_198 = SUB6416(ZEXT464(0x3f800000),0);
  auVar50 = ZEXT1664(ZEXT816(0x3f80000000000000));
  local_1c8._8_4_ = 0x7f800000;
  local_1c8._0_8_ = 0x7f8000007f800000;
  local_1c8._12_4_ = 0x7f800000;
  auVar59 = ZEXT1664(local_1c8);
  local_1a8._8_4_ = 0xff800000;
  local_1a8._0_8_ = 0xff800000ff800000;
  local_1a8._12_4_ = 0xff800000;
  auVar58 = ZEXT1664(local_1a8);
  local_218 = 0;
  auVar60 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
  auVar62 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
  auVar61 = ZEXT1664(local_1a8);
  auVar63 = ZEXT1664(local_1c8);
  local_1b8 = ZEXT816(0);
  local_1f0 = k;
  while( true ) {
    if (r->_end <= uVar20) {
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
        lower.field_0 = local_1c8._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
               bounds0.lower.field_0 + 8) = local_1c8._8_8_;
      *(undefined8 *)
       &(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds0.
        upper.field_0 = local_1a8._0_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.
               bounds0.upper.field_0 + 8) = local_1a8._8_8_;
      (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
      lower.field_0 = auVar63._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).geomBounds.bounds1.
      upper.field_0 = auVar61._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.lower.
      field_0 = auVar59._0_16_;
      (__return_storage_ptr__->super_CentGeom<embree::LBBox<embree::Vec3fa>_>).centBounds.upper.
      field_0 = auVar58._0_16_;
      (__return_storage_ptr__->object_range)._end = local_1b8._0_8_;
      __return_storage_ptr__->num_time_segments = local_1b8._8_8_;
      __return_storage_ptr__->max_num_time_segments = local_218;
      auVar44 = vunpcklpd_avx(auVar50._0_16_,local_198);
      (__return_storage_ptr__->max_time_range).lower = (float)(int)auVar44._0_8_;
      (__return_storage_ptr__->max_time_range).upper = (float)(int)((ulong)auVar44._0_8_ >> 0x20);
      (__return_storage_ptr__->time_range).lower = (float)(int)auVar44._8_8_;
      (__return_storage_ptr__->time_range).upper = (float)(int)((ulong)auVar44._8_8_ >> 0x20);
      return __return_storage_ptr__;
    }
    BVar2 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
            super_Geometry.time_range;
    auVar44._8_8_ = 0;
    auVar44._0_4_ = BVar2.lower;
    auVar44._4_4_ = BVar2.upper;
    auVar44 = vmovshdup_avx(auVar44);
    fVar22 = BVar2.lower;
    fVar23 = auVar44._0_4_ - fVar22;
    uVar13 = *(uint *)(*(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                 super_CurveGeometry.super_Geometry.field_0x58 +
                      *(long *)&(this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).
                                super_CurveGeometry.field_0x68 * uVar20);
    uVar14 = (ulong)(uVar13 + 1);
    pBVar3 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
             vertices.items;
    if (uVar14 < (pBVar3->super_RawBufferView).num) break;
LAB_014da883:
    uVar20 = uVar20 + 1;
  }
  fVar1 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
          super_Geometry.fnumTimeSegments;
  auVar44 = ZEXT416((uint)(fVar1 * ((t0t1->upper - fVar22) / fVar23) * 0.99999976));
  auVar44 = vroundss_avx(auVar44,auVar44,10);
  auVar53 = vminss_avx(auVar44,ZEXT416((uint)fVar1));
  fVar35 = (t0t1->lower - fVar22) / fVar23;
  auVar44 = ZEXT416((uint)(fVar1 * fVar35 * 1.0000002));
  auVar44 = vroundss_avx(auVar44,auVar44,9);
  auVar44 = vmaxss_avx(ZEXT816(0) << 0x40,auVar44);
  pBVar4 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
           tangents.items;
  lVar19 = (long)(int)auVar44._0_4_ * 0x38 + 0x10;
  uVar18 = (long)(int)auVar44._0_4_ - 1;
LAB_014da486:
  uVar18 = uVar18 + 1;
  if ((ulong)(long)(int)auVar53._0_4_ < uVar18) {
    local_140.primID = &local_130;
    fVar23 = (t0t1->upper - fVar22) / fVar23;
    fVar22 = fVar1 * fVar35;
    fVar25 = fVar1 * fVar23;
    auVar57 = vroundss_avx(ZEXT416((uint)fVar22),ZEXT416((uint)fVar22),9);
    auVar38 = vroundss_avx(ZEXT416((uint)fVar25),ZEXT416((uint)fVar25),10);
    auVar44 = vmaxss_avx(auVar57,ZEXT816(0));
    auVar53 = vminss_avx(auVar38,ZEXT416((uint)fVar1));
    iVar16 = (int)auVar44._0_4_;
    fVar34 = auVar53._0_4_;
    iVar15 = (int)auVar57._0_4_;
    iVar17 = -1;
    if (-1 < iVar15) {
      iVar17 = iVar15;
    }
    iVar12 = (int)fVar1 + 1;
    if ((int)auVar38._0_4_ < (int)fVar1 + 1) {
      iVar12 = (int)auVar38._0_4_;
    }
    local_140.this = this;
    local_130 = uVar20;
    linearBounds::anon_class_16_2_07cfa4d6::operator()(&blower0,&local_140,(long)iVar16);
    linearBounds::anon_class_16_2_07cfa4d6::operator()(&bupper1,&local_140,(long)(int)fVar34);
    fVar22 = fVar22 - auVar44._0_4_;
    if (iVar12 - iVar17 == 1) {
      auVar44 = vmaxss_avx(ZEXT416((uint)fVar22),ZEXT816(0) << 0x40);
      fVar22 = auVar44._0_4_;
      fVar23 = 1.0 - fVar22;
      auVar51._0_4_ = fVar22 * bupper1.lower.field_0._0_4_;
      auVar51._4_4_ = fVar22 * bupper1.lower.field_0._4_4_;
      auVar51._8_4_ = fVar22 * bupper1.lower.field_0._8_4_;
      auVar51._12_4_ = fVar22 * bupper1.lower.field_0._12_4_;
      auVar29._4_4_ = fVar23;
      auVar29._0_4_ = fVar23;
      auVar29._8_4_ = fVar23;
      auVar29._12_4_ = fVar23;
      auVar53 = vfmadd231ps_fma(auVar51,auVar29,(undefined1  [16])blower0.lower.field_0);
      auVar54._0_4_ = fVar22 * bupper1.upper.field_0._0_4_;
      auVar54._4_4_ = fVar22 * bupper1.upper.field_0._4_4_;
      auVar54._8_4_ = fVar22 * bupper1.upper.field_0._8_4_;
      auVar54._12_4_ = fVar22 * bupper1.upper.field_0._12_4_;
      auVar57 = vfmadd231ps_fma(auVar54,(undefined1  [16])blower0.upper.field_0,auVar29);
      auVar44 = vmaxss_avx(ZEXT416((uint)(fVar34 - fVar25)),ZEXT816(0) << 0x40);
      fVar22 = auVar44._0_4_;
      fVar23 = 1.0 - fVar22;
      auVar36._0_4_ = fVar22 * blower0.lower.field_0._0_4_;
      auVar36._4_4_ = fVar22 * blower0.lower.field_0._4_4_;
      auVar36._8_4_ = fVar22 * blower0.lower.field_0._8_4_;
      auVar36._12_4_ = fVar22 * blower0.lower.field_0._12_4_;
      auVar30._4_4_ = fVar23;
      auVar30._0_4_ = fVar23;
      auVar30._8_4_ = fVar23;
      auVar30._12_4_ = fVar23;
      auVar38 = vfmadd231ps_fma(auVar36,auVar30,(undefined1  [16])bupper1.lower.field_0);
      auVar40._0_4_ = fVar22 * blower0.upper.field_0._0_4_;
      auVar40._4_4_ = fVar22 * blower0.upper.field_0._4_4_;
      auVar40._8_4_ = fVar22 * blower0.upper.field_0._8_4_;
      auVar40._12_4_ = fVar22 * blower0.upper.field_0._12_4_;
      auVar46 = vfmadd231ps_fma(auVar40,auVar30,(undefined1  [16])bupper1.upper.field_0);
    }
    else {
      linearBounds::anon_class_16_2_07cfa4d6::operator()(&blower1,&local_140,(long)(iVar16 + 1));
      linearBounds::anon_class_16_2_07cfa4d6::operator()
                (&bupper0,&local_140,(long)((int)fVar34 + -1));
      auVar44 = vmaxss_avx(ZEXT416((uint)fVar22),ZEXT816(0) << 0x40);
      fVar24 = auVar44._0_4_;
      fVar22 = 1.0 - fVar24;
      auVar52._0_4_ = fVar24 * blower1.lower.field_0.m128[0];
      auVar52._4_4_ = fVar24 * blower1.lower.field_0.m128[1];
      auVar52._8_4_ = fVar24 * blower1.lower.field_0.m128[2];
      auVar52._12_4_ = fVar24 * blower1.lower.field_0.m128[3];
      auVar31._4_4_ = fVar22;
      auVar31._0_4_ = fVar22;
      auVar31._8_4_ = fVar22;
      auVar31._12_4_ = fVar22;
      auVar53 = vfmadd231ps_fma(auVar52,auVar31,(undefined1  [16])blower0.lower.field_0);
      auVar56._0_4_ = fVar24 * blower1.upper.field_0.m128[0];
      auVar56._4_4_ = fVar24 * blower1.upper.field_0.m128[1];
      auVar56._8_4_ = fVar24 * blower1.upper.field_0.m128[2];
      auVar56._12_4_ = fVar24 * blower1.upper.field_0.m128[3];
      auVar57 = vfmadd231ps_fma(auVar56,auVar31,(undefined1  [16])blower0.upper.field_0);
      auVar44 = vmaxss_avx(ZEXT416((uint)(fVar34 - fVar25)),ZEXT816(0) << 0x40);
      fVar25 = auVar44._0_4_;
      auVar37._0_4_ = fVar25 * bupper0.lower.field_0.m128[0];
      auVar37._4_4_ = fVar25 * bupper0.lower.field_0.m128[1];
      auVar37._8_4_ = fVar25 * bupper0.lower.field_0.m128[2];
      auVar37._12_4_ = fVar25 * bupper0.lower.field_0.m128[3];
      fVar22 = 1.0 - fVar25;
      auVar27._4_4_ = fVar22;
      auVar27._0_4_ = fVar22;
      auVar27._8_4_ = fVar22;
      auVar27._12_4_ = fVar22;
      auVar38 = vfmadd231ps_fma(auVar37,auVar27,(undefined1  [16])bupper1.lower.field_0);
      auVar45._0_4_ = fVar25 * bupper0.upper.field_0.m128[0];
      auVar45._4_4_ = fVar25 * bupper0.upper.field_0.m128[1];
      auVar45._8_4_ = fVar25 * bupper0.upper.field_0.m128[2];
      auVar45._12_4_ = fVar25 * bupper0.upper.field_0.m128[3];
      auVar46 = vfmadd231ps_fma(auVar45,auVar27,(undefined1  [16])bupper1.upper.field_0);
      if (iVar15 < 0) {
        iVar15 = -1;
      }
      itime = (size_t)iVar15;
      while (itime = itime + 1, (long)itime < (long)iVar12) {
        fVar25 = ((float)(int)itime / fVar1 - fVar35) / (fVar23 - fVar35);
        fVar22 = 1.0 - fVar25;
        auVar33._0_4_ = auVar38._0_4_ * fVar25;
        fVar34 = auVar38._4_4_;
        auVar33._4_4_ = fVar34 * fVar25;
        fVar24 = auVar38._8_4_;
        auVar33._8_4_ = fVar24 * fVar25;
        fVar39 = auVar38._12_4_;
        auVar33._12_4_ = fVar39 * fVar25;
        auVar32._4_4_ = fVar22;
        auVar32._0_4_ = fVar22;
        auVar32._8_4_ = fVar22;
        auVar32._12_4_ = fVar22;
        auVar44 = vfmadd231ps_fma(auVar33,auVar32,auVar53);
        auVar28._0_4_ = auVar46._0_4_ * fVar25;
        fVar22 = auVar46._4_4_;
        auVar28._4_4_ = fVar22 * fVar25;
        fVar47 = auVar46._8_4_;
        auVar28._8_4_ = fVar47 * fVar25;
        fVar48 = auVar46._12_4_;
        auVar28._12_4_ = fVar48 * fVar25;
        auVar27 = vfmadd231ps_fma(auVar28,auVar57,auVar32);
        linearBounds::anon_class_16_2_07cfa4d6::operator()(&bi,&local_140,itime);
        local_1e8 = auVar57._0_4_;
        fStack_1e4 = auVar57._4_4_;
        fStack_1e0 = auVar57._8_4_;
        fStack_1dc = auVar57._12_4_;
        local_1d8 = auVar53._0_4_;
        fStack_1d4 = auVar53._4_4_;
        fStack_1d0 = auVar53._8_4_;
        fStack_1cc = auVar53._12_4_;
        auVar44 = vsubps_avx((undefined1  [16])bi.lower.field_0,auVar44);
        auVar53 = vsubps_avx((undefined1  [16])bi.upper.field_0,auVar27);
        auVar57 = vminps_avx(auVar44,ZEXT816(0) << 0x40);
        auVar44 = vmaxps_avx(auVar53,ZEXT816(0) << 0x40);
        auVar53._0_4_ = local_1d8 + auVar57._0_4_;
        auVar53._4_4_ = fStack_1d4 + auVar57._4_4_;
        auVar53._8_4_ = fStack_1d0 + auVar57._8_4_;
        auVar53._12_4_ = fStack_1cc + auVar57._12_4_;
        auVar38._0_4_ = auVar38._0_4_ + auVar57._0_4_;
        auVar38._4_4_ = fVar34 + auVar57._4_4_;
        auVar38._8_4_ = fVar24 + auVar57._8_4_;
        auVar38._12_4_ = fVar39 + auVar57._12_4_;
        auVar57._0_4_ = local_1e8 + auVar44._0_4_;
        auVar57._4_4_ = fStack_1e4 + auVar44._4_4_;
        auVar57._8_4_ = fStack_1e0 + auVar44._8_4_;
        auVar57._12_4_ = fStack_1dc + auVar44._12_4_;
        auVar46._0_4_ = auVar46._0_4_ + auVar44._0_4_;
        auVar46._4_4_ = fVar22 + auVar44._4_4_;
        auVar46._8_4_ = fVar47 + auVar44._8_4_;
        auVar46._12_4_ = fVar48 + auVar44._12_4_;
      }
    }
    aVar8 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vinsertps_avx(auVar53,ZEXT416(geomID),0x30);
    uVar13 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
             super_Geometry.numTimeSteps - 1;
    uVar14 = (ulong)uVar13;
    BVar2 = (this->super_HermiteCurveGeometryInterface<embree::HermiteCurveT>).super_CurveGeometry.
            super_Geometry.time_range;
    auVar26._8_8_ = 0;
    auVar26._0_4_ = BVar2.lower;
    auVar26._4_4_ = BVar2.upper;
    aVar9 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vinsertps_avx(auVar57,ZEXT416((uint)uVar20),0x30)
    ;
    aVar10 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
             vinsertps_avx(auVar38,ZEXT416(uVar13),0x30);
    aVar11 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
             vinsertps_avx(auVar46,ZEXT416(uVar13),0x30);
    auVar53 = vcmpps_avx(local_198,auVar26,1);
    auVar57 = vinsertps_avx(local_198,auVar26,0x50);
    auVar44 = vblendps_avx(auVar26,local_198,2);
    local_198 = vblendvps_avx(auVar44,auVar57,auVar53);
    auVar55._8_4_ = 0x3f000000;
    auVar55._0_8_ = 0x3f0000003f000000;
    auVar55._12_4_ = 0x3f000000;
    auVar41._0_4_ = aVar10.x * 0.5;
    auVar41._4_4_ = aVar10.y * 0.5;
    auVar41._8_4_ = aVar10.z * 0.5;
    auVar41._12_4_ = aVar10.field_3.w * 0.5;
    auVar44 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar8,auVar55);
    auVar49._0_4_ = aVar11.x * 0.5;
    auVar49._4_4_ = aVar11.y * 0.5;
    auVar49._8_4_ = aVar11.z * 0.5;
    auVar49._12_4_ = aVar11.field_3.w * 0.5;
    auVar53 = vfmadd231ps_fma(auVar49,(undefined1  [16])aVar9,auVar55);
    auVar42._0_4_ = auVar44._0_4_ + auVar53._0_4_;
    auVar42._4_4_ = auVar44._4_4_ + auVar53._4_4_;
    auVar42._8_4_ = auVar44._8_4_ + auVar53._8_4_;
    auVar42._12_4_ = auVar44._12_4_ + auVar53._12_4_;
    auVar44 = vminps_avx((undefined1  [16])auVar59._0_16_,auVar42);
    auVar59 = ZEXT1664(auVar44);
    auVar44 = vmaxps_avx((undefined1  [16])auVar58._0_16_,auVar42);
    auVar58 = ZEXT1664(auVar44);
    bVar21 = local_218 < uVar14;
    auVar43[1] = bVar21;
    auVar43[0] = bVar21;
    auVar43[2] = bVar21;
    auVar43[3] = bVar21;
    auVar43[4] = bVar21;
    auVar43[5] = bVar21;
    auVar43[6] = bVar21;
    auVar43[7] = bVar21;
    auVar43[8] = bVar21;
    auVar43[9] = bVar21;
    auVar43[10] = bVar21;
    auVar43[0xb] = bVar21;
    auVar43[0xc] = bVar21;
    auVar43[0xd] = bVar21;
    auVar43[0xe] = bVar21;
    auVar43[0xf] = bVar21;
    auVar44 = vpslld_avx(auVar43,0x1f);
    auVar44 = vblendvps_avx(auVar50._0_16_,auVar26,auVar44);
    auVar50 = ZEXT1664(auVar44);
    auVar44 = vpmovsxbq_avx(ZEXT216(0x101));
    auVar44 = vpinsrq_avx(auVar44,uVar14,1);
    local_1b8 = vpaddq_avx(local_1b8,auVar44);
    if (local_218 <= uVar14) {
      local_218 = uVar14;
    }
    local_1c8 = vminps_avx(local_1c8,(undefined1  [16])aVar8);
    pPVar7 = prims->items;
    pPVar7[local_1f0].lbounds.bounds0.lower.field_0 = aVar8;
    local_1a8 = vmaxps_avx(local_1a8,(undefined1  [16])aVar9);
    pPVar7[local_1f0].lbounds.bounds0.upper.field_0 = aVar9;
    auVar44 = vminps_avx((undefined1  [16])auVar63._0_16_,(undefined1  [16])aVar10);
    auVar63 = ZEXT1664(auVar44);
    pPVar7[local_1f0].lbounds.bounds1.lower.field_0.field_1 = aVar10;
    auVar44 = vmaxps_avx((undefined1  [16])auVar61._0_16_,(undefined1  [16])aVar11);
    auVar61 = ZEXT1664(auVar44);
    pPVar7[local_1f0].lbounds.bounds1.upper.field_0.field_1 = aVar11;
    pPVar7[local_1f0].time_range = BVar2;
    local_1f0 = local_1f0 + 1;
    auVar60 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
    auVar62 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
  }
  else {
    lVar5 = *(long *)((long)pBVar3 + lVar19 + -0x10);
    lVar6 = *(long *)((long)&(pBVar3->super_RawBufferView).ptr_ofs + lVar19);
    auVar44 = *(undefined1 (*) [16])(lVar5 + lVar6 * (ulong)uVar13);
    auVar38 = auVar60._0_16_;
    auVar57 = vcmpps_avx(auVar44,auVar38,2);
    auVar46 = auVar62._0_16_;
    auVar44 = vcmpps_avx(auVar44,auVar46,5);
    auVar44 = vorps_avx(auVar57,auVar44);
    if ((((auVar44 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
         (auVar44 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
        (auVar44 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar44[0xf]) {
      auVar44 = *(undefined1 (*) [16])(lVar5 + lVar6 * uVar14);
      auVar57 = vcmpps_avx(auVar44,auVar38,2);
      auVar44 = vcmpps_avx(auVar44,auVar46,5);
      auVar44 = vorps_avx(auVar57,auVar44);
      if ((((auVar44 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
           (auVar44 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
          (auVar44 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar44[0xf])
      {
        lVar5 = *(long *)((long)pBVar4 + lVar19 + -0x10);
        lVar6 = *(long *)((long)&(pBVar4->super_RawBufferView).ptr_ofs + lVar19);
        auVar44 = *(undefined1 (*) [16])(lVar5 + lVar6 * (ulong)uVar13);
        auVar57 = vcmpps_avx(auVar44,auVar38,2);
        auVar44 = vcmpps_avx(auVar44,auVar46,5);
        auVar44 = vorps_avx(auVar57,auVar44);
        if ((((auVar44 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
             (auVar44 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
            (auVar44 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) && -1 < auVar44[0xf]
           ) goto code_r0x014da519;
      }
    }
  }
  goto LAB_014da883;
code_r0x014da519:
  lVar19 = lVar19 + 0x38;
  auVar44 = *(undefined1 (*) [16])(lVar5 + lVar6 * uVar14);
  auVar57 = vcmpps_avx(auVar44,auVar38,2);
  auVar44 = vcmpps_avx(auVar44,auVar46,5);
  auVar44 = vorps_avx(auVar57,auVar44);
  if ((((auVar44 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
       (auVar44 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
      (auVar44 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar44[0xf] < '\0')
  goto LAB_014da883;
  goto LAB_014da486;
}

Assistant:

PrimInfoMB createPrimRefMBArray(mvector<PrimRefMB>& prims, const BBox1f& t0t1, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfoMB pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, this->timeSegmentRange(t0t1))) continue;
          const LBBox3fa lbox = linearBounds(j,t0t1);
          const PrimRefMB prim(lbox,this->numTimeSegments(),this->time_range,this->numTimeSegments(),geomID,unsigned(j));
          pinfo.add_primref(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }